

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O0

void __thiscall
covec::Covec<float>::
initialize<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
          (Covec<float> *this,
          vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          *probs,mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 *gen,size_t dim,float sigma,size_t neg_size,float eta0,float eta1,
          bool enable_chopout,vector<unsigned_long,_std::allocator<unsigned_long>_> *share)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *this_00;
  pointer pdVar6;
  size_t sVar7;
  reference pvVar8;
  size_t in_RCX;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  *in_RSI;
  Covec<float> *in_RDI;
  size_t in_R8;
  byte in_R9B;
  float in_XMM1_Da;
  float in_XMM2_Da;
  reference rVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  size_t K;
  size_t k;
  vector<float,_std::allocator<float>_> v;
  size_t j;
  element_type *vs;
  size_t num_entries;
  value_type *prob;
  size_t i_1;
  normal_distribution<float> normal;
  size_t order;
  size_t i;
  size_t counter;
  vector<bool,_std::allocator<bool>_> first_of_sharings;
  result_type_conflict in_stack_fffffffffffffd98;
  result_type_conflict in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  result_type_conflict in_stack_fffffffffffffda4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffda8;
  allocator_type *in_stack_fffffffffffffdb0;
  undefined1 *in_stack_fffffffffffffdb8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffdc0;
  unsigned_long *in_stack_fffffffffffffdc8;
  discrete_distribution<int> *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffdf8;
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  *this_01;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  size_type local_1a0;
  undefined1 local_191;
  vector<float,_std::allocator<float>_> local_190;
  pointer local_178;
  element_type *local_170;
  vector<bool,_std::allocator<bool>_> local_168;
  unsigned_long local_138 [2];
  undefined1 local_128 [56];
  size_type local_f0;
  reference local_d8;
  reference local_d0;
  ulong local_c0;
  size_type local_a8;
  ulong local_90;
  value_type local_88;
  undefined1 local_58 [31];
  byte local_39;
  float local_38;
  float local_34;
  size_t local_30;
  size_t local_20;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  *local_10;
  
  local_39 = in_R9B & 1;
  local_38 = in_XMM2_Da;
  local_34 = in_XMM1_Da;
  local_30 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  ::operator=((vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
              (vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
               *)in_RDI);
  in_RDI->dim_ = local_20;
  in_RDI->neg_size_ = local_30;
  in_RDI->eta0_ = local_34;
  in_RDI->eta1_ = local_38;
  in_RDI->chopout_enabled_ = (bool)(local_39 & 1);
  memset(local_58,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1519a9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  std::vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
  clear((vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_> *)
        0x1519f8);
  std::
  vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
  ::clear((vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
           *)0x151a09);
  std::
  vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::clear((vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *)0x151a1d);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x151a2a);
  local_88 = 0;
  local_90 = 0;
  do {
    uVar1 = local_90;
    sVar3 = std::
            vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
            ::size(local_10);
    if (sVar3 <= uVar1) {
      local_a8 = std::
                 vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                 ::size(&in_RDI->probs_);
      std::
      vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
      ::resize((vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      std::
      vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::resize((vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      std::vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
      ::resize((vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      std::normal_distribution<float>::normal_distribution
                ((normal_distribution<float> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98);
      for (local_c0 = 0; local_c0 < local_a8; local_c0 = local_c0 + 1) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
        local_d0 = rVar9;
        bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_d0);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_d8 = std::
                     vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                     ::operator[](&in_RDI->probs_,local_c0);
          std::
          __shared_ptr_access<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x151d6a);
          std::discrete_distribution<int>::probabilities(in_stack_fffffffffffffdd8);
          local_f0 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)(local_128 + 0x20));
          std::make_shared<unsigned_long,unsigned_long>(in_stack_fffffffffffffdc8);
          std::
          vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
          operator[](&in_RDI->num_entries_,local_c0);
          std::shared_ptr<unsigned_long>::operator=
                    ((shared_ptr<unsigned_long> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (shared_ptr<unsigned_long> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)0x151ddc);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0);
          std::
          __shared_ptr_access<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x151df6);
          std::discrete_distribution<int>::probabilities(in_stack_fffffffffffffdd8);
          in_stack_fffffffffffffdd8 = (discrete_distribution<int> *)local_128;
          pdVar6 = (pointer)std::vector<double,_std::allocator<double>_>::size
                                      ((vector<double,_std::allocator<double>_> *)
                                       in_stack_fffffffffffffdd8);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0);
          local_128._24_8_ = pdVar6;
          dimension(in_RDI);
          std::allocator<float>::allocator((allocator<float> *)0x151e5c);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc0,
                     (size_type)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
          std::
          make_shared<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,unsigned_long&,std::vector<float,std::allocator<float>>>
                    (in_stack_fffffffffffffdc8,
                     (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc0);
          std::
          vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
          ::operator[](&in_RDI->vs_,local_c0);
          in_stack_fffffffffffffdc8 = local_138;
          std::
          shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
          ::operator=((shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                      (shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          std::
          shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
          ::~shared_ptr((shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                         *)0x151ecc);
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdb0);
          std::allocator<float>::~allocator((allocator<float> *)0x151ee6);
          std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,unsigned_long&>
                    (in_stack_fffffffffffffdc8);
          std::
          vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::operator[](&in_RDI->cs_,local_c0);
          in_stack_fffffffffffffdc0 = &local_168;
          std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
                    ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
                    ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     0x151f35);
          std::
          vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
          ::operator[](&in_RDI->vs_,local_c0);
          local_170 = std::
                      __shared_ptr_access<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator*((__shared_ptr_access<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::resize((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
          for (local_178 = (pointer)0x0; local_178 < (ulong)local_128._24_8_;
              local_178 = (pointer)((long)local_178 + 1)) {
            in_stack_fffffffffffffdb0 = (allocator_type *)in_RDI->dim_;
            in_stack_fffffffffffffdb8 = &local_191;
            std::allocator<float>::allocator((allocator<float> *)0x151fba);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdc0,
                       (size_type)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
            std::allocator<float>::~allocator((allocator<float> *)0x151fe0);
            local_1a0 = 0;
            sVar7 = dimension(in_RDI);
            for (; local_1a0 < sVar7; local_1a0 = local_1a0 + 1) {
              in_stack_fffffffffffffda4 =
                   std::normal_distribution<float>::operator()
                             ((normal_distribution<float> *)
                              CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                              (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
              pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](&local_190,local_1a0);
              *pvVar8 = in_stack_fffffffffffffda4;
            }
            std::
            vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ::operator[](local_170,(size_type)local_178);
            std::vector<float,_std::allocator<float>_>::operator=
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (vector<float,_std::allocator<float>_> *)in_RDI);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffdb0);
          }
          in_stack_fffffffffffffe44 = 0;
          std::
          make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>,unsigned_long&,int>
                    (in_stack_fffffffffffffdc8,(int *)in_stack_fffffffffffffdc0);
          std::
          vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::operator[](&in_RDI->cs_,local_c0);
          std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
                    ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
                    ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     0x1521e0);
        }
        else {
          this_01 = &in_RDI->vs_;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&in_RDI->share_,local_c0);
          std::
          vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
          ::operator[](this_01,*pvVar5);
          std::
          vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
          ::operator[](&in_RDI->vs_,local_c0);
          std::
          shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
          ::operator=((shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                      (shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&in_RDI->share_,local_c0);
          std::
          vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
          operator[](&in_RDI->num_entries_,*pvVar5);
          std::
          vector<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>::
          operator[](&in_RDI->num_entries_,local_c0);
          std::shared_ptr<unsigned_long>::operator=
                    ((shared_ptr<unsigned_long> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (shared_ptr<unsigned_long> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          this_00 = &in_RDI->cs_;
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&in_RDI->share_,local_c0);
          std::
          vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::operator[](this_00,*pvVar5);
          std::
          vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::operator[](&in_RDI->cs_,local_c0);
          std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator=
                    ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        }
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x152208);
      return;
    }
    bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffdb0);
    if (bVar2) {
LAB_00151aa6:
      std::vector<bool,_std::allocator<bool>_>::push_back
                (in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
      local_88 = local_88 + 1;
    }
    else {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000008,local_90);
      if (*pvVar4 == local_88) goto LAB_00151aa6;
      std::vector<bool,_std::allocator<bool>_>::push_back
                (in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
    }
    local_90 = local_90 + 1;
  } while( true );
}

Assistant:

void Covec<Real>::initialize(const std::vector<std::shared_ptr<std::discrete_distribution<int> > >& probs,
                               RandomGenerator& gen,
                               const std::size_t dim,
                               const Real sigma,
                               const std::size_t neg_size,
                               const Real eta0,
                               const Real eta1,
			       const bool enable_chopout,
                               const std::vector<std::size_t>& share
                               )
  {
    this->probs_ = probs;
    this->dim_ = dim;
    this->neg_size_ = neg_size;
    this->eta0_ = eta0;
    this->eta1_ = eta1;
    this->chopout_enabled_ = enable_chopout;
    this->keep_dim_ = std::vector<std::size_t>();
    this->share_ = share;

    this->num_entries_.clear();
    this->vs_.clear();
    this->cs_.clear();

    std::vector<bool> first_of_sharings;
    {
      std::size_t counter=0;
      for(std::size_t i=0; i < probs.size(); ++i){
        if(share.empty() || share[i] == counter){
          first_of_sharings.push_back(true);
          ++counter;
        }else{
          first_of_sharings.push_back(false);
        }
      }
    }

    std::size_t order = this->probs_.size();
    this->vs_.resize(order);
    this->cs_.resize(order);
    this->num_entries_.resize(order);
    std::normal_distribution<Real> normal(0.0, sigma);
    for(std::size_t i = 0; i < order; ++i){
      if(!first_of_sharings[i]){
        assert(this->probs_[i] == this->probs_[this->share_[i]]);
        this->vs_[i] = this->vs_[this->share_[i]];
        this->num_entries_[i] = this->num_entries_[this->share_[i]];
        this->cs_[i] = this->cs_[this->share_[i]];
      }else{
        const auto& prob = this->probs_[i];

        // allocate
        this->num_entries_[i] =
          std::make_shared<std::size_t>(prob->probabilities().size());
        std::size_t num_entries = prob->probabilities().size();
        this->vs_[i] =
          std::make_shared<std::vector<std::vector<Real> > >
          (num_entries, std::vector<Real>(this->dimension()));
        this->cs_[i] =
          std::make_shared<std::vector<std::size_t> >(num_entries);
	   
        auto& vs = *this->vs_[i];
        vs.resize(num_entries);
        for(std::size_t j = 0; j < num_entries; ++j){
          std::vector<Real> v(this->dim_);
          for(std::size_t k = 0, K = this->dimension(); k < K; ++k){
            v[k] = normal(gen);
          }
          vs[j] = v;
        }
        this->cs_[i] = std::make_shared<std::vector<std::size_t> >(num_entries, 0);
      }
    }
  }